

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall
nonius::standard_reporter::do_params_start(standard_reporter *this,parameters *params)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *os;
  
  if ((this->summary == false) &&
     ((params->
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      )._M_h._M_element_count != 0)) {
    pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (&(this->super_reporter).os);
    os = std::operator<<(pbVar1,"\n\nnew round for parameters\n");
    operator<<(os,params);
    return;
  }
  return;
}

Assistant:

void do_params_start(parameters const& params) override {
            if(!summary && !params.empty()) report_stream() << "\n\nnew round for parameters\n" << params;
        }